

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

uint __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseHex4<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,size_t escapeOffset
          )

{
  Ch CVar1;
  bool bVar2;
  int local_30;
  uint uStack_2c;
  Ch c;
  int i;
  uint codepoint;
  size_t escapeOffset_local;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is_local;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  uStack_2c = 0;
  local_30 = 0;
  do {
    if (3 < local_30) {
      return uStack_2c;
    }
    CVar1 = EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Peek(is);
    uStack_2c = (int)CVar1 + uStack_2c * 0x10;
    if ((CVar1 < '0') || ('9' < CVar1)) {
      if ((CVar1 < 'A') || ('F' < CVar1)) {
        if ((CVar1 < 'a') || ('f' < CVar1)) {
          bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                          ,0x300,
                          "unsigned int rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseHex4(InputStream &, size_t) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>]"
                         );
          }
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)this,kParseErrorStringUnicodeEscapeInvalidHex,escapeOffset);
          bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this);
          if (bVar2) {
            return 0;
          }
        }
        else {
          uStack_2c = uStack_2c - 0x57;
        }
      }
      else {
        uStack_2c = uStack_2c - 0x37;
      }
    }
    else {
      uStack_2c = uStack_2c - 0x30;
    }
    EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Take(is);
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

unsigned ParseHex4(InputStream& is, size_t escapeOffset) {
        unsigned codepoint = 0;
        for (int i = 0; i < 4; i++) {
            Ch c = is.Peek();
            codepoint <<= 4;
            codepoint += static_cast<unsigned>(c);
            if (c >= '0' && c <= '9')
                codepoint -= '0';
            else if (c >= 'A' && c <= 'F')
                codepoint -= 'A' - 10;
            else if (c >= 'a' && c <= 'f')
                codepoint -= 'a' - 10;
            else {
                RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorStringUnicodeEscapeInvalidHex, escapeOffset);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(0);
            }
            is.Take();
        }
        return codepoint;
    }